

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doit.cpp
# Opt level: O0

void doit(gulcalcopts *opt)

{
  pointer *this;
  bool bVar1;
  code *local_2ab8;
  undefined1 local_2a80 [8];
  gulcalc g;
  offset_in_gulcalc_to_subr mode;
  undefined1 local_2850 [8];
  getRands rnd0;
  getRands rnd;
  _func_void_void_ptr_int_int *corrWriter;
  _func_void_void_ptr_int_int *lossWriter;
  _func_void_void_ptr_int_int *covWriter;
  _func_void_void_ptr_int_int *itmWriter;
  char local_84 [4];
  undefined1 local_80 [3];
  bool bSuccess;
  int stream_type;
  vector<float,_std::allocator<float>_> coverages;
  map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
  item_map;
  undefined1 local_28 [8];
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> damagebindictionary_vec;
  gulcalcopts *opt_local;
  
  damagebindictionary_vec.
  super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)opt;
  std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::vector
            ((vector<damagebindictionary,_std::allocator<damagebindictionary>_> *)local_28);
  getdamagebindictionary
            ((vector<damagebindictionary,_std::allocator<damagebindictionary>_> *)local_28);
  this = &coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::
  map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
  ::map((map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
         *)this);
  getitems((map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
            *)this);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_80);
  getcoverages((vector<float,_std::allocator<float>_> *)local_80);
  local_84[0] = '\0';
  local_84[1] = '\0';
  local_84[2] = '\0';
  local_84[3] = '\0';
  bVar1 = getrec(local_84,_stdin,4);
  if (bVar1) {
    covWriter = (_func_void_void_ptr_int_int *)0x0;
    lossWriter = (_func_void_void_ptr_int_int *)0x0;
    corrWriter = (_func_void_void_ptr_int_int *)0x0;
    rnd.rnd_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    getRands::getRands((getRands *)
                       &rnd0.rnd_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (damagebindictionary_vec.
                        super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->bin_index,
                       (int)(damagebindictionary_vec.
                             super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->bin_from,
                       (int)(damagebindictionary_vec.
                             super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->bin_to);
    getRands::getRands((getRands *)local_2850,
                       (damagebindictionary_vec.
                        super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->bin_index,
                       (int)(damagebindictionary_vec.
                             super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->bin_from,
                       (int)(damagebindictionary_vec.
                             super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->bin_to);
    itemout = *(FILE **)&damagebindictionary_vec.
                         super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[6].interval_type;
    covout = *(FILE **)&damagebindictionary_vec.
                        super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[7].bin_from;
    corrout = *(FILE **)&damagebindictionary_vec.
                         super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[7].interpolation;
    g.p3_ = (longlong)gulcalc::mode0;
    if (((uint)damagebindictionary_vec.
               super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage[5].interpolation & 1) == 1) {
      if (damagebindictionary_vec.
          super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[8].bin_index < 0) {
        covWriter = itemWriter;
      }
      else {
        corrWriter = itemWriter;
        if (0 < damagebindictionary_vec.
                super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage[8].bin_index) {
          g.p3_ = (longlong)gulcalc::mode1;
        }
      }
    }
    if (((uint)damagebindictionary_vec.
               super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage[5].interpolation & 0x100) == 0x100) {
      lossWriter = coverageWriter;
    }
    if (((uint)damagebindictionary_vec.
               super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage[5].interpolation & 0x10000) == 0x10000) {
      rnd.rnd_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)correlatedWriter;
    }
    gulcalc::gulcalc((gulcalc *)local_2a80,
                     (vector<damagebindictionary,_std::allocator<damagebindictionary>_> *)local_28,
                     (vector<float,_std::allocator<float>_> *)local_80,
                     (map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
                      *)&coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                     (getRands *)
                     &rnd0.rnd_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(getRands *)local_2850,covWriter,
                     lossWriter,corrWriter,
                     (_func_void_void_ptr_int_int *)
                     rnd.rnd_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,iGetrec,
                     (gulcalcopts *)
                     damagebindictionary_vec.
                     super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((g.p3_ & 1U) == 0) {
      local_2ab8 = (code *)g.p3_;
    }
    else {
      local_2ab8 = *(code **)((long)((mt19937 *)((long)local_2a80 + 0x18))->_M_x + g.p3_ + -0x19);
    }
    (*local_2ab8)(local_2a80);
    gulcalc::~gulcalc((gulcalc *)local_2a80);
    getRands::~getRands((getRands *)local_2850);
    getRands::~getRands((getRands *)
                        &rnd0.rnd_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"FATAL: gulcalc: Error no stream type returned\n");
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_80);
  std::
  map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
  ::~map((map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
          *)&coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::~vector
            ((vector<damagebindictionary,_std::allocator<damagebindictionary>_> *)local_28);
  return;
}

Assistant:

void doit(const gulcalcopts &opt)
{
	std::vector<damagebindictionary> damagebindictionary_vec;
	getdamagebindictionary(damagebindictionary_vec);

	std::map<item_map_key, std::vector<item_map_rec> > item_map;
	getitems(item_map);

	std::vector<OASIS_FLOAT> coverages;
	getcoverages(coverages);

	//size_t total_bins = damagebindictionary_vec.size();
	//int max_recsize = (int)(total_bins * sizeof(prob_mean)) + sizeof(damagecdfrec) + sizeof(int);
	//int last_event_id = -1;

	int stream_type = 0;
	bool bSuccess = getrec((char *)&stream_type, stdin, sizeof(stream_type));
	if (bSuccess == false) {
		cerr << "FATAL: gulcalc: Error no stream type returned\n";
		return; // exit thread if failed
	}

	void(*itmWriter)(const void *ibuf, int size, int count);
	void(*covWriter)(const void *ibuf, int size, int count);
    	void (*lossWriter)(const void *ibuf, int size, int count);
    	void(*corrWriter)(const void *ibuf, int size, int count);

	itmWriter = 0;
	covWriter = 0;
    	lossWriter = 0;
    	corrWriter = 0;

	getRands rnd(opt.rndopt, opt.rand_vector_size, opt.rand_seed);
	getRands rnd0(opt.rndopt, opt.rand_vector_size, opt.rand_seed);
	itemout = opt.itemout;
	covout = opt.covout;
	corrout = opt.corrout;

	void (gulcalc::*mode)();
	mode = &gulcalc::mode0;   // Classic gulcalc
	if (opt.itemLevelOutput == true) {
		if (opt.allocRule > -1) {
			lossWriter = itemWriter;   // Loss stream
			if (opt.allocRule > 0) mode = &gulcalc::mode1;   // Back allocation
		} else {
			itmWriter = itemWriter;   // Item stream
		}
	}
	if (opt.coverageLevelOutput == true) covWriter = coverageWriter;
    	if(opt.correlatedLevelOutput == true) corrWriter = correlatedWriter;
	gulcalc g(damagebindictionary_vec, coverages, item_map, rnd, rnd0, itmWriter, covWriter, lossWriter, corrWriter, iGetrec, opt);
	(g.*mode)();   // g.mode0() or g.mode1()

	return;

}